

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *args_1;
  EdgeControlSpecifierSyntax *pEVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::EdgeDescriptorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EdgeControlSpecifierSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EdgeControlSpecifierSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EdgeControlSpecifierSyntax>(
        node.openBracket.deepClone(alloc),
        *deepClone(node.descriptors, alloc),
        node.closeBracket.deepClone(alloc)
    );
}